

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O1

void av1_compute_stats_sse4_1
               (int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,int use_downsampled_wiener_stats)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [12];
  int iVar9;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  long *plVar13;
  undefined1 *puVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  undefined1 *puVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  uint8_t *puVar25;
  int *piVar26;
  int64_t *piVar27;
  long lVar28;
  uint8_t *puVar29;
  ushort uVar30;
  uint uVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  int64_t *piVar34;
  int iVar35;
  long lVar36;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar37 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int32_t M_int32_row [7] [7];
  int32_t sumY [7] [7];
  int32_t M_int32 [7] [7];
  int64_t M_int64 [7] [7];
  int32_t H_int32_row [49] [56];
  int32_t H_int32 [49] [56];
  int64_t H_int64 [49] [56];
  undefined1 local_b1e8 [352];
  undefined1 local_b088 [16];
  undefined1 local_b078 [16];
  undefined1 local_b068 [16];
  undefined1 local_b058 [16];
  undefined1 local_b048 [16];
  undefined1 local_b038 [16];
  undefined4 local_b028;
  undefined1 local_afb8 [16];
  undefined1 local_afa8 [16];
  undefined1 local_af98 [16];
  undefined1 local_af88 [16];
  undefined1 local_af78 [16];
  undefined1 local_af68 [16];
  undefined4 local_af58;
  undefined1 local_aee8 [16];
  undefined1 local_aed8 [16];
  undefined1 local_aec8 [16];
  undefined1 local_aeb8 [16];
  undefined1 local_aea8 [16];
  undefined1 local_ae98 [16];
  undefined4 local_ae88;
  undefined1 local_ae18 [16];
  undefined1 local_ae08 [16];
  undefined1 local_adf8 [16];
  undefined1 local_ade8 [16];
  undefined1 local_add8 [16];
  undefined1 local_adc8 [16];
  undefined4 local_adb8;
  long local_ad48 [50];
  undefined1 local_abb8 [144];
  int local_ab28 [16];
  int local_aae8 [2692];
  undefined1 local_80d8 [10976];
  undefined1 local_55f8 [21960];
  
  if (wiener_win == 5) {
    if (v_start < v_end) {
      lVar24 = (long)v_start;
      puVar25 = dgd + dgd_stride * lVar24;
      uVar10 = 0;
      do {
        lVar19 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar10 = uVar10 + puVar25[lVar19];
            lVar19 = lVar19 + 1;
          } while (h_end != lVar19);
        }
        lVar24 = lVar24 + 1;
        puVar25 = puVar25 + dgd_stride;
      } while (lVar24 != v_end);
    }
    else {
      uVar10 = 0;
    }
    uVar18 = (ulong)((v_end - v_start) * (h_end - h_start));
    iVar23 = 0;
    local_adb8 = 0;
    local_adc8 = (undefined1  [16])0x0;
    local_add8 = (undefined1  [16])0x0;
    local_ade8 = (undefined1  [16])0x0;
    local_adf8 = (undefined1  [16])0x0;
    local_ae08 = (undefined1  [16])0x0;
    local_ae18 = (undefined1  [16])0x0;
    local_af58 = 0;
    local_af68 = (undefined1  [16])0x0;
    local_af78 = (undefined1  [16])0x0;
    local_af88 = (undefined1  [16])0x0;
    local_af98 = (undefined1  [16])0x0;
    local_afa8 = (undefined1  [16])0x0;
    local_afb8 = (undefined1  [16])0x0;
    memset(local_ad48,0,200);
    memset(local_80d8,0,4000);
    memset(local_abb8,0,4000);
    memset(local_55f8,0,8000);
    local_ae88 = 0;
    local_ae98 = (undefined1  [16])0x0;
    local_aea8 = (undefined1  [16])0x0;
    local_aeb8 = (undefined1  [16])0x0;
    local_aec8 = (undefined1  [16])0x0;
    local_aed8 = (undefined1  [16])0x0;
    local_aee8 = (undefined1  [16])0x0;
    local_b028 = 0;
    local_b038 = (undefined1  [16])0x0;
    local_b048 = (undefined1  [16])0x0;
    local_b058 = (undefined1  [16])0x0;
    local_b068 = (undefined1  [16])0x0;
    local_b078 = (undefined1  [16])0x0;
    local_b088 = (undefined1  [16])0x0;
    if (v_start < v_end) {
      uVar20 = (ulong)(dgd_stride * 2);
      iVar16 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
      lVar24 = (long)dgd_stride;
      iVar23 = 0;
      auVar38 = extraout_XMM0_00;
      do {
        iVar9 = v_end - v_start;
        iVar12 = 0x40;
        if (iVar9 < 0x40) {
          iVar12 = iVar9;
        }
        if (0 < iVar9) {
          iVar9 = v_start;
          do {
            iVar17 = (iVar12 + v_start) - iVar9;
            if (3 < iVar17) {
              iVar17 = iVar16;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar17 = iVar16;
            }
            iVar16 = iVar17;
            local_b028 = 0;
            local_b038 = (undefined1  [16])0x0;
            local_b048 = (undefined1  [16])0x0;
            local_b058 = (undefined1  [16])0x0;
            local_b068 = (undefined1  [16])0x0;
            local_b078 = (undefined1  [16])0x0;
            local_b088 = (undefined1  [16])0x0;
            local_afb8 = (undefined1  [16])0x0;
            local_afa8 = (undefined1  [16])0x0;
            local_af98 = (undefined1  [16])0x0;
            local_af88 = (undefined1  [16])0x0;
            local_af78 = (undefined1  [16])0x0;
            local_af68 = (undefined1  [16])0x0;
            auVar8 = local_b1e8._4_12_;
            auVar51._12_4_ = 0;
            auVar51._0_12_ = local_b1e8._4_12_;
            local_b1e8._0_16_ = auVar51 << 0x20;
            local_af58 = 0;
            memset(local_abb8,0,4000);
            lVar19 = (long)(iVar9 * dgd_stride) + (-2 - uVar20);
            iVar17 = iVar9 * src_stride;
            uVar22 = (ulong)(uint)h_start;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              puVar25 = dgd + (long)(iVar9 * dgd_stride) + ~uVar20 + (long)h_start;
              auVar52._12_4_ = 0;
              auVar52._0_12_ = auVar8;
              local_b1e8._0_16_ = auVar52 << 0x20;
              uVar22 = (long)h_start;
              do {
                lVar28 = uVar22 + lVar19;
                bVar1 = src[uVar22 + (long)iVar17];
                bVar2 = src[uVar22 + (long)iVar17 + 1];
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + uVar22 + lVar19),_DAT_0050f8a0);
                in_XMM1 = pmovzxbw(in_XMM1,auVar38);
                auVar53[1] = 0;
                auVar53[0] = auVar38[8];
                auVar53[2] = auVar38[9];
                auVar53[3] = 0;
                auVar53[4] = auVar38[10];
                auVar53[5] = 0;
                auVar53[6] = auVar38[0xb];
                auVar53[7] = 0;
                auVar53[8] = auVar38[0xc];
                auVar53[9] = 0;
                auVar53[10] = auVar38[0xd];
                auVar53[0xb] = 0;
                auVar53[0xc] = auVar38[0xe];
                auVar53[0xd] = 0;
                auVar53[0xe] = auVar38[0xf];
                auVar53[0xf] = 0;
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar24 + lVar28),_DAT_0050f8a0);
                in_XMM3 = pmovzxbw(in_XMM3,auVar38);
                auVar54[1] = 0;
                auVar54[0] = auVar38[8];
                auVar54[2] = auVar38[9];
                auVar54[3] = 0;
                auVar54[4] = auVar38[10];
                auVar54[5] = 0;
                auVar54[6] = auVar38[0xb];
                auVar54[7] = 0;
                auVar54[8] = auVar38[0xc];
                auVar54[9] = 0;
                auVar54[10] = auVar38[0xd];
                auVar54[0xb] = 0;
                auVar54[0xc] = auVar38[0xe];
                auVar54[0xd] = 0;
                auVar54[0xe] = auVar38[0xf];
                auVar54[0xf] = 0;
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + uVar20 + lVar28),_DAT_0050f8a0);
                in_XMM5 = pmovzxbw(in_XMM5,auVar38);
                auVar55[1] = 0;
                auVar55[0] = auVar38[8];
                auVar55[2] = auVar38[9];
                auVar55[3] = 0;
                auVar55[4] = auVar38[10];
                auVar55[5] = 0;
                auVar55[6] = auVar38[0xb];
                auVar55[7] = 0;
                auVar55[8] = auVar38[0xc];
                auVar55[9] = 0;
                auVar55[10] = auVar38[0xd];
                auVar55[0xb] = 0;
                auVar55[0xc] = auVar38[0xe];
                auVar55[0xd] = 0;
                auVar55[0xe] = auVar38[0xf];
                auVar55[0xf] = 0;
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar24 * 3 + lVar28),_DAT_0050f8a0);
                in_XMM7 = pmovzxbw(in_XMM7,auVar38);
                auVar61[1] = 0;
                auVar61[0] = auVar38[8];
                auVar61[2] = auVar38[9];
                auVar61[3] = 0;
                auVar61[4] = auVar38[10];
                auVar61[5] = 0;
                auVar61[6] = auVar38[0xb];
                auVar61[7] = 0;
                auVar61[8] = auVar38[0xc];
                auVar61[9] = 0;
                auVar61[10] = auVar38[0xd];
                auVar61[0xb] = 0;
                auVar61[0xc] = auVar38[0xe];
                auVar61[0xd] = 0;
                auVar61[0xe] = auVar38[0xf];
                auVar61[0xf] = 0;
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar24 * 4 + lVar28),_DAT_0050f8a0);
                in_XMM9 = pmovzxbw(in_XMM9,auVar38);
                auVar60[1] = 0;
                auVar60[0] = auVar38[8];
                auVar60[2] = auVar38[9];
                auVar60[3] = 0;
                auVar60[4] = auVar38[10];
                auVar60[5] = 0;
                auVar60[6] = auVar38[0xb];
                auVar60[7] = 0;
                auVar60[8] = auVar38[0xc];
                auVar60[9] = 0;
                auVar60[10] = auVar38[0xd];
                auVar60[0xb] = 0;
                auVar60[0xc] = auVar38[0xe];
                auVar60[0xd] = 0;
                auVar60[0xe] = auVar38[0xf];
                auVar60[0xf] = 0;
                piVar11 = local_ab28;
                puVar32 = local_b088;
                puVar33 = local_afb8;
                lVar28 = 0;
                puVar29 = puVar25;
                do {
                  lVar36 = 0;
                  piVar26 = piVar11;
                  do {
                    bVar3 = puVar29[lVar36 + -1];
                    bVar4 = puVar29[lVar36];
                    *(uint *)(puVar32 + lVar36 * 4) =
                         *(int *)(puVar32 + lVar36 * 4) + (uint)bVar4 + (uint)bVar3;
                    *(uint *)(puVar33 + lVar36 * 4) =
                         *(int *)(puVar33 + lVar36 * 4) +
                         (uint)bVar4 * (uint)bVar2 + (uint)bVar3 * (uint)bVar1;
                    lVar15 = lVar36 + -1;
                    lVar36 = lVar36 + 1;
                    auVar38 = pshuflw(ZEXT216(*(ushort *)(puVar29 + lVar15)),
                                      ZEXT216(*(ushort *)(puVar29 + lVar15)),0);
                    auVar38 = pmovzxbw(auVar38,auVar38);
                    auVar51 = pmaddwd(auVar38,in_XMM1);
                    auVar52 = pmaddwd(auVar38,auVar53);
                    piVar26[-0x24] = auVar51._0_4_ + piVar26[-0x24];
                    piVar26[-0x23] = auVar51._4_4_ + piVar26[-0x23];
                    piVar26[-0x22] = auVar51._8_4_ + piVar26[-0x22];
                    piVar26[-0x21] = auVar51._12_4_ + piVar26[-0x21];
                    piVar26[-0x20] = auVar52._0_4_ + piVar26[-0x20];
                    piVar26[-0x1f] = auVar52._4_4_ + piVar26[-0x1f];
                    piVar26[-0x1e] = auVar52._8_4_ + piVar26[-0x1e];
                    piVar26[-0x1d] = auVar52._12_4_ + piVar26[-0x1d];
                    auVar51 = pmaddwd(auVar38,in_XMM3);
                    auVar52 = pmaddwd(auVar38,auVar54);
                    piVar26[-0x1c] = auVar51._0_4_ + piVar26[-0x1c];
                    piVar26[-0x1b] = auVar51._4_4_ + piVar26[-0x1b];
                    piVar26[-0x1a] = auVar51._8_4_ + piVar26[-0x1a];
                    piVar26[-0x19] = auVar51._12_4_ + piVar26[-0x19];
                    piVar26[-0x18] = auVar52._0_4_ + piVar26[-0x18];
                    piVar26[-0x17] = auVar52._4_4_ + piVar26[-0x17];
                    piVar26[-0x16] = auVar52._8_4_ + piVar26[-0x16];
                    piVar26[-0x15] = auVar52._12_4_ + piVar26[-0x15];
                    auVar51 = pmaddwd(auVar38,in_XMM5);
                    auVar52 = pmaddwd(auVar38,auVar55);
                    piVar26[-0x14] = auVar51._0_4_ + piVar26[-0x14];
                    piVar26[-0x13] = auVar51._4_4_ + piVar26[-0x13];
                    piVar26[-0x12] = auVar51._8_4_ + piVar26[-0x12];
                    piVar26[-0x11] = auVar51._12_4_ + piVar26[-0x11];
                    piVar26[-0x10] = auVar52._0_4_ + piVar26[-0x10];
                    piVar26[-0xf] = auVar52._4_4_ + piVar26[-0xf];
                    piVar26[-0xe] = auVar52._8_4_ + piVar26[-0xe];
                    piVar26[-0xd] = auVar52._12_4_ + piVar26[-0xd];
                    auVar51 = pmaddwd(auVar38,in_XMM7);
                    auVar52 = pmaddwd(auVar38,auVar61);
                    piVar26[-0xc] = auVar51._0_4_ + piVar26[-0xc];
                    piVar26[-0xb] = auVar51._4_4_ + piVar26[-0xb];
                    piVar26[-10] = auVar51._8_4_ + piVar26[-10];
                    piVar26[-9] = auVar51._12_4_ + piVar26[-9];
                    piVar26[-8] = auVar52._0_4_ + piVar26[-8];
                    piVar26[-7] = auVar52._4_4_ + piVar26[-7];
                    piVar26[-6] = auVar52._8_4_ + piVar26[-6];
                    piVar26[-5] = auVar52._12_4_ + piVar26[-5];
                    auVar51 = pmaddwd(auVar38,in_XMM9);
                    auVar38 = pmaddwd(auVar38,auVar60);
                    piVar26[-4] = auVar51._0_4_ + piVar26[-4];
                    piVar26[-3] = auVar51._4_4_ + piVar26[-3];
                    piVar26[-2] = auVar51._8_4_ + piVar26[-2];
                    piVar26[-1] = auVar51._12_4_ + piVar26[-1];
                    *piVar26 = auVar38._0_4_ + *piVar26;
                    piVar26[1] = auVar38._4_4_ + piVar26[1];
                    piVar26[2] = auVar38._8_4_ + piVar26[2];
                    piVar26[3] = auVar38._12_4_ + piVar26[3];
                    piVar26 = piVar26 + 200;
                  } while (lVar36 != 5);
                  lVar28 = lVar28 + 1;
                  puVar33 = puVar33 + 0x14;
                  puVar32 = puVar32 + 0x14;
                  puVar29 = puVar29 + lVar24;
                  piVar11 = piVar11 + 0x28;
                } while (lVar28 != 5);
                local_b1e8._0_4_ = local_b1e8._0_4_ + (uint)bVar1 + (uint)bVar2;
                uVar22 = uVar22 + 2;
                puVar25 = puVar25 + 2;
              } while ((long)uVar22 < (long)(int)(h_end & 0xfffffffeU));
            }
            iVar35 = local_b1e8._0_4_;
            if ((h_end & 1U) != 0) {
              lVar28 = (long)(int)uVar22;
              puVar25 = dgd + lVar28 + lVar19;
              bVar1 = src[lVar28 + iVar17];
              auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar28 + lVar19),_DAT_0050f8a0);
              auVar51 = pmovzxbw(in_XMM1,auVar38);
              auVar63[1] = 0;
              auVar63[0] = auVar38[8];
              auVar63[2] = auVar38[9];
              auVar63[3] = 0;
              auVar63[4] = auVar38[10];
              auVar63[5] = 0;
              auVar63[6] = auVar38[0xb];
              auVar63[7] = 0;
              auVar63[8] = auVar38[0xc];
              auVar63[9] = 0;
              auVar63[10] = auVar38[0xd];
              auVar63[0xb] = 0;
              auVar63[0xc] = auVar38[0xe];
              auVar63[0xd] = 0;
              auVar63[0xe] = auVar38[0xf];
              auVar63[0xf] = 0;
              auVar38 = pshufb(*(undefined1 (*) [16])(puVar25 + lVar24),_DAT_0050f8a0);
              in_XMM3 = pmovzxbw(in_XMM3,auVar38);
              auVar56[1] = 0;
              auVar56[0] = auVar38[8];
              auVar56[2] = auVar38[9];
              auVar56[3] = 0;
              auVar56[4] = auVar38[10];
              auVar56[5] = 0;
              auVar56[6] = auVar38[0xb];
              auVar56[7] = 0;
              auVar56[8] = auVar38[0xc];
              auVar56[9] = 0;
              auVar56[10] = auVar38[0xd];
              auVar56[0xb] = 0;
              auVar56[0xc] = auVar38[0xe];
              auVar56[0xd] = 0;
              auVar56[0xe] = auVar38[0xf];
              auVar56[0xf] = 0;
              auVar38 = pshufb(*(undefined1 (*) [16])(puVar25 + uVar20),_DAT_0050f8a0);
              in_XMM5 = pmovzxbw(in_XMM5,auVar38);
              auVar57[1] = 0;
              auVar57[0] = auVar38[8];
              auVar57[2] = auVar38[9];
              auVar57[3] = 0;
              auVar57[4] = auVar38[10];
              auVar57[5] = 0;
              auVar57[6] = auVar38[0xb];
              auVar57[7] = 0;
              auVar57[8] = auVar38[0xc];
              auVar57[9] = 0;
              auVar57[10] = auVar38[0xd];
              auVar57[0xb] = 0;
              auVar57[0xc] = auVar38[0xe];
              auVar57[0xd] = 0;
              auVar57[0xe] = auVar38[0xf];
              auVar57[0xf] = 0;
              auVar38 = pshufb(*(undefined1 (*) [16])(puVar25 + lVar24 * 3),_DAT_0050f8a0);
              in_XMM7 = pmovzxbw(in_XMM7,auVar38);
              auVar58[1] = 0;
              auVar58[0] = auVar38[8];
              auVar58[2] = auVar38[9];
              auVar58[3] = 0;
              auVar58[4] = auVar38[10];
              auVar58[5] = 0;
              auVar58[6] = auVar38[0xb];
              auVar58[7] = 0;
              auVar58[8] = auVar38[0xc];
              auVar58[9] = 0;
              auVar58[10] = auVar38[0xd];
              auVar58[0xb] = 0;
              auVar58[0xc] = auVar38[0xe];
              auVar58[0xd] = 0;
              auVar58[0xe] = auVar38[0xf];
              auVar58[0xf] = 0;
              auVar38 = pshufb(*(undefined1 (*) [16])(puVar25 + lVar24 * 4),_DAT_0050f8a0);
              in_XMM9 = pmovzxbw(in_XMM9,auVar38);
              auVar59[1] = 0;
              auVar59[0] = auVar38[8];
              auVar59[2] = auVar38[9];
              auVar59[3] = 0;
              auVar59[4] = auVar38[10];
              auVar59[5] = 0;
              auVar59[6] = auVar38[0xb];
              auVar59[7] = 0;
              auVar59[8] = auVar38[0xc];
              auVar59[9] = 0;
              auVar59[10] = auVar38[0xd];
              auVar59[0xb] = 0;
              auVar59[0xc] = auVar38[0xe];
              auVar59[0xd] = 0;
              auVar59[0xe] = auVar38[0xf];
              auVar59[0xf] = 0;
              piVar11 = local_ab28;
              puVar32 = local_b088;
              puVar33 = local_afb8;
              lVar19 = 0;
              do {
                lVar28 = 0;
                piVar26 = piVar11;
                do {
                  uVar30 = (ushort)puVar25[lVar28];
                  *(uint *)(puVar32 + lVar28 * 4) = *(int *)(puVar32 + lVar28 * 4) + (uint)uVar30;
                  *(uint *)(puVar33 + lVar28 * 4) =
                       *(int *)(puVar33 + lVar28 * 4) + (uint)uVar30 * (uint)bVar1;
                  auVar38 = pshuflw(ZEXT216(uVar30),ZEXT216(uVar30),0);
                  auVar38 = pmovzxbw(auVar38,auVar38);
                  auVar52 = pmaddwd(auVar38,auVar51);
                  auVar53 = pmaddwd(auVar38,auVar63);
                  piVar26[-0x24] = auVar52._0_4_ + piVar26[-0x24];
                  piVar26[-0x23] = auVar52._4_4_ + piVar26[-0x23];
                  piVar26[-0x22] = auVar52._8_4_ + piVar26[-0x22];
                  piVar26[-0x21] = auVar52._12_4_ + piVar26[-0x21];
                  piVar26[-0x20] = auVar53._0_4_ + piVar26[-0x20];
                  piVar26[-0x1f] = auVar53._4_4_ + piVar26[-0x1f];
                  piVar26[-0x1e] = auVar53._8_4_ + piVar26[-0x1e];
                  piVar26[-0x1d] = auVar53._12_4_ + piVar26[-0x1d];
                  auVar52 = pmaddwd(auVar38,in_XMM3);
                  auVar53 = pmaddwd(auVar38,auVar56);
                  piVar26[-0x1c] = auVar52._0_4_ + piVar26[-0x1c];
                  piVar26[-0x1b] = auVar52._4_4_ + piVar26[-0x1b];
                  piVar26[-0x1a] = auVar52._8_4_ + piVar26[-0x1a];
                  piVar26[-0x19] = auVar52._12_4_ + piVar26[-0x19];
                  piVar26[-0x18] = auVar53._0_4_ + piVar26[-0x18];
                  piVar26[-0x17] = auVar53._4_4_ + piVar26[-0x17];
                  piVar26[-0x16] = auVar53._8_4_ + piVar26[-0x16];
                  piVar26[-0x15] = auVar53._12_4_ + piVar26[-0x15];
                  auVar52 = pmaddwd(auVar38,in_XMM5);
                  auVar53 = pmaddwd(auVar38,auVar57);
                  piVar26[-0x14] = auVar52._0_4_ + piVar26[-0x14];
                  piVar26[-0x13] = auVar52._4_4_ + piVar26[-0x13];
                  piVar26[-0x12] = auVar52._8_4_ + piVar26[-0x12];
                  piVar26[-0x11] = auVar52._12_4_ + piVar26[-0x11];
                  piVar26[-0x10] = auVar53._0_4_ + piVar26[-0x10];
                  piVar26[-0xf] = auVar53._4_4_ + piVar26[-0xf];
                  piVar26[-0xe] = auVar53._8_4_ + piVar26[-0xe];
                  piVar26[-0xd] = auVar53._12_4_ + piVar26[-0xd];
                  auVar52 = pmaddwd(auVar38,in_XMM7);
                  auVar53 = pmaddwd(auVar38,auVar58);
                  piVar26[-0xc] = auVar52._0_4_ + piVar26[-0xc];
                  piVar26[-0xb] = auVar52._4_4_ + piVar26[-0xb];
                  piVar26[-10] = auVar52._8_4_ + piVar26[-10];
                  piVar26[-9] = auVar52._12_4_ + piVar26[-9];
                  piVar26[-8] = auVar53._0_4_ + piVar26[-8];
                  piVar26[-7] = auVar53._4_4_ + piVar26[-7];
                  piVar26[-6] = auVar53._8_4_ + piVar26[-6];
                  piVar26[-5] = auVar53._12_4_ + piVar26[-5];
                  auVar52 = pmaddwd(auVar38,in_XMM9);
                  auVar38 = pmaddwd(auVar38,auVar59);
                  piVar26[-4] = auVar52._0_4_ + piVar26[-4];
                  piVar26[-3] = auVar52._4_4_ + piVar26[-3];
                  piVar26[-2] = auVar52._8_4_ + piVar26[-2];
                  piVar26[-1] = auVar52._12_4_ + piVar26[-1];
                  *piVar26 = auVar38._0_4_ + *piVar26;
                  piVar26[1] = auVar38._4_4_ + piVar26[1];
                  piVar26[2] = auVar38._8_4_ + piVar26[2];
                  piVar26[3] = auVar38._12_4_ + piVar26[3];
                  lVar28 = lVar28 + 1;
                  piVar26 = piVar26 + 200;
                } while (lVar28 != 5);
                lVar19 = lVar19 + 1;
                puVar33 = puVar33 + 0x14;
                puVar32 = puVar32 + 0x14;
                puVar25 = puVar25 + lVar24;
                piVar11 = piVar11 + 0x28;
              } while (lVar19 != 5);
              iVar35 = local_b1e8._0_4_ + (uint)bVar1;
            }
            puVar32 = local_b088;
            puVar33 = local_aee8;
            puVar14 = local_afb8;
            puVar21 = local_ae18;
            lVar19 = 0;
            do {
              lVar28 = 0;
              do {
                *(int *)(puVar33 + lVar28 * 4) =
                     *(int *)(puVar33 + lVar28 * 4) + *(int *)(puVar32 + lVar28 * 4) * iVar16;
                *(int *)(puVar21 + lVar28 * 4) =
                     *(int *)(puVar21 + lVar28 * 4) + *(int *)(puVar14 + lVar28 * 4) * iVar16;
                lVar28 = lVar28 + 1;
              } while (lVar28 != 5);
              lVar19 = lVar19 + 1;
              puVar21 = puVar21 + 0x14;
              puVar14 = puVar14 + 0x14;
              puVar33 = puVar33 + 0x14;
              puVar32 = puVar32 + 0x14;
            } while (lVar19 != 5);
            auVar38._4_4_ = iVar16;
            auVar38._0_4_ = iVar16;
            auVar38._8_4_ = iVar16;
            auVar38._12_4_ = iVar16;
            puVar32 = local_80d8;
            puVar33 = local_abb8;
            lVar19 = 0;
            do {
              lVar28 = 0;
              do {
                auVar51 = pmulld(*(undefined1 (*) [16])(puVar33 + lVar28 * 4),auVar38);
                piVar11 = (int *)(puVar32 + lVar28 * 4);
                in_XMM1._0_4_ = auVar51._0_4_ + *piVar11;
                in_XMM1._4_4_ = auVar51._4_4_ + piVar11[1];
                in_XMM1._8_4_ = auVar51._8_4_ + piVar11[2];
                in_XMM1._12_4_ = auVar51._12_4_ + piVar11[3];
                *(undefined1 (*) [16])(puVar32 + lVar28 * 4) = in_XMM1;
                lVar28 = lVar28 + 4;
              } while (lVar28 != 0x28);
              lVar19 = lVar19 + 1;
              puVar33 = puVar33 + 0xa0;
              puVar32 = puVar32 + 0xa0;
            } while (lVar19 != 0x19);
            iVar23 = iVar23 + iVar35 * iVar16;
            iVar9 = iVar9 + iVar16;
          } while (iVar9 < iVar12 + v_start);
        }
        puVar32 = local_ae18;
        plVar13 = local_ad48;
        lVar19 = 0;
        do {
          lVar28 = 0;
          do {
            plVar13[lVar28] = plVar13[lVar28] + (long)*(int *)(puVar32 + lVar28 * 4);
            *(undefined4 *)(puVar32 + lVar28 * 4) = 0;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 5);
          lVar19 = lVar19 + 1;
          plVar13 = plVar13 + 5;
          puVar32 = puVar32 + 0x14;
        } while (lVar19 != 5);
        puVar32 = local_55f8;
        puVar33 = local_80d8;
        lVar19 = 0;
        do {
          lVar28 = 0;
          do {
            auVar51 = pmovsxdq(auVar38,*(undefined8 *)(puVar33 + lVar28 * 4));
            auVar38._0_8_ = auVar51._0_8_ + *(long *)(puVar32 + lVar28 * 8);
            auVar38._8_8_ = auVar51._8_8_ + *(long *)((long)(puVar32 + lVar28 * 8) + 8);
            *(undefined1 (*) [16])(puVar32 + lVar28 * 8) = auVar38;
            *(undefined8 *)(puVar33 + lVar28 * 4) = 0;
            lVar28 = lVar28 + 2;
          } while (lVar28 != 0x28);
          lVar19 = lVar19 + 1;
          puVar33 = puVar33 + 0xa0;
          puVar32 = puVar32 + 0x140;
        } while (lVar19 != 0x19);
        v_start = v_start + 0x40;
      } while (v_start < v_end);
    }
    uVar10 = uVar10 / uVar18 & 0xff;
    lVar19 = uVar18 * uVar10 * uVar10;
    lVar24 = 0;
    puVar32 = local_55f8;
    do {
      lVar28 = 0;
      puVar33 = puVar32;
      piVar27 = H;
      do {
        iVar16 = *(int *)(local_aee8 + lVar28 * 4 + lVar24 * 0x14);
        M[lVar28 * 5 + lVar24] =
             (local_ad48[lVar24 * 5 + lVar28] + lVar19) - ((long)iVar16 + (long)iVar23) * uVar10;
        piVar11 = (int *)local_aee8;
        lVar36 = 0;
        piVar34 = piVar27;
        puVar14 = puVar33;
        do {
          lVar15 = 0;
          piVar26 = piVar11;
          do {
            *(ulong *)((long)piVar34 + lVar15) =
                 (*(long *)(puVar14 + lVar15 * 8) + lVar19) -
                 ((long)*piVar26 + (long)iVar16) * uVar10;
            lVar15 = lVar15 + 8;
            piVar26 = piVar26 + 5;
          } while (lVar15 != 0x28);
          lVar36 = lVar36 + 1;
          piVar34 = piVar34 + 5;
          piVar11 = piVar11 + 1;
          puVar14 = puVar14 + 8;
        } while (lVar36 != 5);
        lVar28 = lVar28 + 1;
        piVar27 = piVar27 + 0x7d;
        puVar33 = puVar33 + 0x640;
      } while (lVar28 != 5);
      lVar24 = lVar24 + 1;
      H = H + 0x19;
      puVar32 = puVar32 + 0x140;
    } while (lVar24 != 5);
  }
  else {
    if (wiener_win != 7) {
      av1_compute_stats_c(wiener_win,dgd,src,dgd_avg,src_avg,h_start,h_end,v_start,v_end,dgd_stride,
                          src_stride,M,H,use_downsampled_wiener_stats);
      return;
    }
    lVar24 = (long)dgd_stride;
    if (v_start < v_end) {
      lVar19 = (long)v_start;
      puVar25 = dgd + lVar24 * lVar19;
      uVar10 = 0;
      do {
        lVar28 = (long)h_start;
        if (h_start < h_end) {
          do {
            uVar10 = uVar10 + puVar25[lVar28];
            lVar28 = lVar28 + 1;
          } while (h_end != lVar28);
        }
        lVar19 = lVar19 + 1;
        puVar25 = puVar25 + lVar24;
      } while (lVar19 != v_end);
    }
    else {
      uVar10 = 0;
    }
    uVar18 = (ulong)((v_end - v_start) * (h_end - h_start));
    memset(local_ae18,0,0xc4);
    memset(local_afb8,0,0xc4);
    memset(local_ad48,0,0x188);
    memset(local_80d8,0,0x2ae0);
    memset(local_abb8,0,0x2ae0);
    memset(local_55f8,0,0x55c0);
    memset(local_aee8,0,0xc4);
    memset(local_b088,0,0xc4);
    iVar23 = 0;
    if (v_start < v_end) {
      lVar19 = (long)(dgd_stride * 3);
      iVar16 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
      iVar23 = 0;
      auVar37 = extraout_XMM0;
      do {
        iVar9 = v_end - v_start;
        iVar12 = 0x40;
        if (iVar9 < 0x40) {
          iVar12 = iVar9;
        }
        if (0 < iVar9) {
          iVar9 = v_start;
          do {
            uVar20 = (ulong)(uint)h_start;
            iVar17 = (iVar12 + v_start) - iVar9;
            if (3 < iVar17) {
              iVar17 = iVar16;
            }
            if (use_downsampled_wiener_stats == 0) {
              iVar17 = iVar16;
            }
            iVar16 = iVar17;
            iVar17 = 0;
            memset(local_b088,0,0xc4);
            memset(local_afb8,0,0xc4);
            memset(local_abb8,0,0x2ae0);
            lVar28 = (long)(iVar9 * dgd_stride) + (-3 - lVar19);
            iVar35 = iVar9 * src_stride;
            if (h_start < (int)(h_end & 0xfffffffeU)) {
              puVar25 = dgd + (long)(iVar9 * dgd_stride) + (h_start - lVar19) + -2;
              iVar17 = 0;
              uVar20 = (long)h_start;
              do {
                lVar36 = uVar20 + lVar28;
                bVar1 = src[uVar20 + (long)iVar35];
                bVar2 = src[uVar20 + (long)iVar35 + 1];
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + uVar20 + lVar28),_DAT_0050f8a0);
                in_XMM2 = pmovzxbw(in_XMM2,auVar38);
                auVar39[1] = 0;
                auVar39[0] = auVar38[8];
                auVar39[2] = auVar38[9];
                auVar39[3] = 0;
                auVar39[4] = auVar38[10];
                auVar39[5] = 0;
                auVar39[6] = auVar38[0xb];
                auVar39[7] = 0;
                auVar39[8] = auVar38[0xc];
                auVar39[9] = 0;
                auVar39[10] = auVar38[0xd];
                auVar39[0xb] = 0;
                auVar39[0xc] = auVar38[0xe];
                auVar39[0xd] = 0;
                auVar39[0xe] = auVar38[0xf];
                auVar39[0xf] = 0;
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar24 + lVar36),_DAT_0050f8a0);
                auVar51 = pmovzxbw(in_XMM2,auVar38);
                auVar40[1] = 0;
                auVar40[0] = auVar38[8];
                auVar40[2] = auVar38[9];
                auVar40[3] = 0;
                auVar40[4] = auVar38[10];
                auVar40[5] = 0;
                auVar40[6] = auVar38[0xb];
                auVar40[7] = 0;
                auVar40[8] = auVar38[0xc];
                auVar40[9] = 0;
                auVar40[10] = auVar38[0xd];
                auVar40[0xb] = 0;
                auVar40[0xc] = auVar38[0xe];
                auVar40[0xd] = 0;
                auVar40[0xe] = auVar38[0xf];
                auVar40[0xf] = 0;
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar24 * 2 + lVar36),_DAT_0050f8a0);
                auVar52 = pmovzxbw(auVar51,auVar38);
                auVar41[1] = 0;
                auVar41[0] = auVar38[8];
                auVar41[2] = auVar38[9];
                auVar41[3] = 0;
                auVar41[4] = auVar38[10];
                auVar41[5] = 0;
                auVar41[6] = auVar38[0xb];
                auVar41[7] = 0;
                auVar41[8] = auVar38[0xc];
                auVar41[9] = 0;
                auVar41[10] = auVar38[0xd];
                auVar41[0xb] = 0;
                auVar41[0xc] = auVar38[0xe];
                auVar41[0xd] = 0;
                auVar41[0xe] = auVar38[0xf];
                auVar41[0xf] = 0;
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar19 + lVar36),_DAT_0050f8a0);
                auVar53 = pmovzxbw(auVar52,auVar38);
                auVar42[1] = 0;
                auVar42[0] = auVar38[8];
                auVar42[2] = auVar38[9];
                auVar42[3] = 0;
                auVar42[4] = auVar38[10];
                auVar42[5] = 0;
                auVar42[6] = auVar38[0xb];
                auVar42[7] = 0;
                auVar42[8] = auVar38[0xc];
                auVar42[9] = 0;
                auVar42[10] = auVar38[0xd];
                auVar42[0xb] = 0;
                auVar42[0xc] = auVar38[0xe];
                auVar42[0xd] = 0;
                auVar42[0xe] = auVar38[0xf];
                auVar42[0xf] = 0;
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar24 * 4 + lVar36),_DAT_0050f8a0);
                auVar54 = pmovzxbw(auVar53,auVar38);
                auVar43[1] = 0;
                auVar43[0] = auVar38[8];
                auVar43[2] = auVar38[9];
                auVar43[3] = 0;
                auVar43[4] = auVar38[10];
                auVar43[5] = 0;
                auVar43[6] = auVar38[0xb];
                auVar43[7] = 0;
                auVar43[8] = auVar38[0xc];
                auVar43[9] = 0;
                auVar43[10] = auVar38[0xd];
                auVar43[0xb] = 0;
                auVar43[0xc] = auVar38[0xe];
                auVar43[0xd] = 0;
                auVar43[0xe] = auVar38[0xf];
                auVar43[0xf] = 0;
                auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar24 * 5 + lVar36),_DAT_0050f8a0);
                auVar55 = pmovzxbw(auVar54,auVar38);
                auVar44[1] = 0;
                auVar44[0] = auVar38[8];
                auVar44[2] = auVar38[9];
                auVar44[3] = 0;
                auVar44[4] = auVar38[10];
                auVar44[5] = 0;
                auVar44[6] = auVar38[0xb];
                auVar44[7] = 0;
                auVar44[8] = auVar38[0xc];
                auVar44[9] = 0;
                auVar44[10] = auVar38[0xd];
                auVar44[0xb] = 0;
                auVar44[0xc] = auVar38[0xe];
                auVar44[0xd] = 0;
                auVar44[0xe] = auVar38[0xf];
                auVar44[0xf] = 0;
                auVar61 = pshufb(*(undefined1 (*) [16])(dgd + lVar24 * 6 + lVar36),_DAT_0050f8a0);
                auVar38 = pmovzxbw(auVar44,auVar61);
                auVar62[1] = 0;
                auVar62[0] = auVar61[8];
                auVar62[2] = auVar61[9];
                auVar62[3] = 0;
                auVar62[4] = auVar61[10];
                auVar62[5] = 0;
                auVar62[6] = auVar61[0xb];
                auVar62[7] = 0;
                auVar62[8] = auVar61[0xc];
                auVar62[9] = 0;
                auVar62[10] = auVar61[0xd];
                auVar62[0xb] = 0;
                auVar62[0xc] = auVar61[0xe];
                auVar62[0xd] = 0;
                auVar62[0xe] = auVar61[0xf];
                auVar62[0xf] = 0;
                piVar11 = local_aae8;
                puVar32 = local_b088;
                puVar33 = local_afb8;
                lVar36 = 0;
                puVar29 = puVar25;
                do {
                  lVar15 = 0;
                  piVar26 = piVar11;
                  do {
                    bVar3 = puVar29[lVar15 + -1];
                    bVar4 = puVar29[lVar15];
                    *(uint *)(puVar32 + lVar15 * 4) =
                         *(int *)(puVar32 + lVar15 * 4) + (uint)bVar4 + (uint)bVar3;
                    *(uint *)(puVar33 + lVar15 * 4) =
                         *(int *)(puVar33 + lVar15 * 4) +
                         (uint)bVar4 * (uint)bVar2 + (uint)bVar3 * (uint)bVar1;
                    auVar61 = pshuflw(ZEXT216(*(ushort *)(puVar29 + lVar15 + -1)),
                                      ZEXT216(*(ushort *)(puVar29 + lVar15 + -1)),0);
                    auVar60 = pmovzxbw(auVar61,auVar61);
                    auVar63 = pmaddwd(auVar60,in_XMM2);
                    auVar61 = pmaddwd(auVar60,auVar39);
                    piVar26[-0x34] = auVar63._0_4_ + piVar26[-0x34];
                    piVar26[-0x33] = auVar63._4_4_ + piVar26[-0x33];
                    piVar26[-0x32] = auVar63._8_4_ + piVar26[-0x32];
                    piVar26[-0x31] = auVar63._12_4_ + piVar26[-0x31];
                    piVar26[-0x30] = auVar61._0_4_ + piVar26[-0x30];
                    piVar26[-0x2f] = auVar61._4_4_ + piVar26[-0x2f];
                    piVar26[-0x2e] = auVar61._8_4_ + piVar26[-0x2e];
                    piVar26[-0x2d] = auVar61._12_4_ + piVar26[-0x2d];
                    auVar61 = pmaddwd(auVar60,auVar51);
                    auVar63 = pmaddwd(auVar60,auVar40);
                    piVar26[-0x2c] = auVar61._0_4_ + piVar26[-0x2c];
                    piVar26[-0x2b] = auVar61._4_4_ + piVar26[-0x2b];
                    piVar26[-0x2a] = auVar61._8_4_ + piVar26[-0x2a];
                    piVar26[-0x29] = auVar61._12_4_ + piVar26[-0x29];
                    piVar26[-0x28] = auVar63._0_4_ + piVar26[-0x28];
                    piVar26[-0x27] = auVar63._4_4_ + piVar26[-0x27];
                    piVar26[-0x26] = auVar63._8_4_ + piVar26[-0x26];
                    piVar26[-0x25] = auVar63._12_4_ + piVar26[-0x25];
                    auVar61 = pmaddwd(auVar60,auVar52);
                    auVar63 = pmaddwd(auVar60,auVar41);
                    piVar26[-0x24] = auVar61._0_4_ + piVar26[-0x24];
                    piVar26[-0x23] = auVar61._4_4_ + piVar26[-0x23];
                    piVar26[-0x22] = auVar61._8_4_ + piVar26[-0x22];
                    piVar26[-0x21] = auVar61._12_4_ + piVar26[-0x21];
                    piVar26[-0x20] = auVar63._0_4_ + piVar26[-0x20];
                    piVar26[-0x1f] = auVar63._4_4_ + piVar26[-0x1f];
                    piVar26[-0x1e] = auVar63._8_4_ + piVar26[-0x1e];
                    piVar26[-0x1d] = auVar63._12_4_ + piVar26[-0x1d];
                    auVar61 = pmaddwd(auVar60,auVar53);
                    auVar63 = pmaddwd(auVar60,auVar42);
                    piVar26[-0x1c] = auVar61._0_4_ + piVar26[-0x1c];
                    piVar26[-0x1b] = auVar61._4_4_ + piVar26[-0x1b];
                    piVar26[-0x1a] = auVar61._8_4_ + piVar26[-0x1a];
                    piVar26[-0x19] = auVar61._12_4_ + piVar26[-0x19];
                    piVar26[-0x18] = auVar63._0_4_ + piVar26[-0x18];
                    piVar26[-0x17] = auVar63._4_4_ + piVar26[-0x17];
                    piVar26[-0x16] = auVar63._8_4_ + piVar26[-0x16];
                    piVar26[-0x15] = auVar63._12_4_ + piVar26[-0x15];
                    auVar61 = pmaddwd(auVar60,auVar54);
                    auVar63 = pmaddwd(auVar60,auVar43);
                    piVar26[-0x14] = auVar61._0_4_ + piVar26[-0x14];
                    piVar26[-0x13] = auVar61._4_4_ + piVar26[-0x13];
                    piVar26[-0x12] = auVar61._8_4_ + piVar26[-0x12];
                    piVar26[-0x11] = auVar61._12_4_ + piVar26[-0x11];
                    piVar26[-0x10] = auVar63._0_4_ + piVar26[-0x10];
                    piVar26[-0xf] = auVar63._4_4_ + piVar26[-0xf];
                    piVar26[-0xe] = auVar63._8_4_ + piVar26[-0xe];
                    piVar26[-0xd] = auVar63._12_4_ + piVar26[-0xd];
                    auVar61 = pmaddwd(auVar60,auVar55);
                    auVar63 = pmaddwd(auVar60,auVar44);
                    piVar26[-0xc] = auVar61._0_4_ + piVar26[-0xc];
                    piVar26[-0xb] = auVar61._4_4_ + piVar26[-0xb];
                    piVar26[-10] = auVar61._8_4_ + piVar26[-10];
                    piVar26[-9] = auVar61._12_4_ + piVar26[-9];
                    piVar26[-8] = auVar63._0_4_ + piVar26[-8];
                    piVar26[-7] = auVar63._4_4_ + piVar26[-7];
                    piVar26[-6] = auVar63._8_4_ + piVar26[-6];
                    piVar26[-5] = auVar63._12_4_ + piVar26[-5];
                    auVar61 = pmaddwd(auVar60,auVar38);
                    auVar60 = pmaddwd(auVar60,auVar62);
                    piVar26[-4] = auVar61._0_4_ + piVar26[-4];
                    piVar26[-3] = auVar61._4_4_ + piVar26[-3];
                    piVar26[-2] = auVar61._8_4_ + piVar26[-2];
                    piVar26[-1] = auVar61._12_4_ + piVar26[-1];
                    *piVar26 = auVar60._0_4_ + *piVar26;
                    piVar26[1] = auVar60._4_4_ + piVar26[1];
                    piVar26[2] = auVar60._8_4_ + piVar26[2];
                    piVar26[3] = auVar60._12_4_ + piVar26[3];
                    lVar15 = lVar15 + 1;
                    piVar26 = piVar26 + 0x188;
                  } while (lVar15 != 7);
                  lVar36 = lVar36 + 1;
                  puVar33 = puVar33 + 0x1c;
                  puVar32 = puVar32 + 0x1c;
                  puVar29 = puVar29 + lVar24;
                  piVar11 = piVar11 + 0x38;
                } while (lVar36 != 7);
                iVar17 = iVar17 + (uint)bVar1 + (uint)bVar2;
                uVar20 = uVar20 + 2;
                puVar25 = puVar25 + 2;
              } while ((long)uVar20 < (long)(int)(h_end & 0xfffffffeU));
            }
            if ((h_end & 1U) != 0) {
              lVar36 = (long)(int)uVar20;
              puVar25 = dgd + lVar36 + lVar28;
              bVar1 = src[lVar36 + iVar35];
              auVar38 = pshufb(*(undefined1 (*) [16])(dgd + lVar36 + lVar28),_DAT_0050f8a0);
              in_XMM2 = pmovzxbw(in_XMM2,auVar38);
              auVar45[1] = 0;
              auVar45[0] = auVar38[8];
              auVar45[2] = auVar38[9];
              auVar45[3] = 0;
              auVar45[4] = auVar38[10];
              auVar45[5] = 0;
              auVar45[6] = auVar38[0xb];
              auVar45[7] = 0;
              auVar45[8] = auVar38[0xc];
              auVar45[9] = 0;
              auVar45[10] = auVar38[0xd];
              auVar45[0xb] = 0;
              auVar45[0xc] = auVar38[0xe];
              auVar45[0xd] = 0;
              auVar45[0xe] = auVar38[0xf];
              auVar45[0xf] = 0;
              auVar38 = pshufb(*(undefined1 (*) [16])(puVar25 + lVar24),_DAT_0050f8a0);
              auVar51 = pmovzxbw(in_XMM2,auVar38);
              auVar46[1] = 0;
              auVar46[0] = auVar38[8];
              auVar46[2] = auVar38[9];
              auVar46[3] = 0;
              auVar46[4] = auVar38[10];
              auVar46[5] = 0;
              auVar46[6] = auVar38[0xb];
              auVar46[7] = 0;
              auVar46[8] = auVar38[0xc];
              auVar46[9] = 0;
              auVar46[10] = auVar38[0xd];
              auVar46[0xb] = 0;
              auVar46[0xc] = auVar38[0xe];
              auVar46[0xd] = 0;
              auVar46[0xe] = auVar38[0xf];
              auVar46[0xf] = 0;
              auVar38 = pshufb(*(undefined1 (*) [16])(puVar25 + lVar24 * 2),_DAT_0050f8a0);
              auVar52 = pmovzxbw(auVar51,auVar38);
              auVar47[1] = 0;
              auVar47[0] = auVar38[8];
              auVar47[2] = auVar38[9];
              auVar47[3] = 0;
              auVar47[4] = auVar38[10];
              auVar47[5] = 0;
              auVar47[6] = auVar38[0xb];
              auVar47[7] = 0;
              auVar47[8] = auVar38[0xc];
              auVar47[9] = 0;
              auVar47[10] = auVar38[0xd];
              auVar47[0xb] = 0;
              auVar47[0xc] = auVar38[0xe];
              auVar47[0xd] = 0;
              auVar47[0xe] = auVar38[0xf];
              auVar47[0xf] = 0;
              auVar38 = pshufb(*(undefined1 (*) [16])(puVar25 + lVar19),_DAT_0050f8a0);
              auVar53 = pmovzxbw(auVar52,auVar38);
              auVar48[1] = 0;
              auVar48[0] = auVar38[8];
              auVar48[2] = auVar38[9];
              auVar48[3] = 0;
              auVar48[4] = auVar38[10];
              auVar48[5] = 0;
              auVar48[6] = auVar38[0xb];
              auVar48[7] = 0;
              auVar48[8] = auVar38[0xc];
              auVar48[9] = 0;
              auVar48[10] = auVar38[0xd];
              auVar48[0xb] = 0;
              auVar48[0xc] = auVar38[0xe];
              auVar48[0xd] = 0;
              auVar48[0xe] = auVar38[0xf];
              auVar48[0xf] = 0;
              auVar38 = pshufb(*(undefined1 (*) [16])(puVar25 + lVar24 * 4),_DAT_0050f8a0);
              auVar54 = pmovzxbw(auVar53,auVar38);
              auVar49[1] = 0;
              auVar49[0] = auVar38[8];
              auVar49[2] = auVar38[9];
              auVar49[3] = 0;
              auVar49[4] = auVar38[10];
              auVar49[5] = 0;
              auVar49[6] = auVar38[0xb];
              auVar49[7] = 0;
              auVar49[8] = auVar38[0xc];
              auVar49[9] = 0;
              auVar49[10] = auVar38[0xd];
              auVar49[0xb] = 0;
              auVar49[0xc] = auVar38[0xe];
              auVar49[0xd] = 0;
              auVar49[0xe] = auVar38[0xf];
              auVar49[0xf] = 0;
              auVar38 = pshufb(*(undefined1 (*) [16])(puVar25 + lVar24 * 5),_DAT_0050f8a0);
              auVar55 = pmovzxbw(auVar54,auVar38);
              auVar50[1] = 0;
              auVar50[0] = auVar38[8];
              auVar50[2] = auVar38[9];
              auVar50[3] = 0;
              auVar50[4] = auVar38[10];
              auVar50[5] = 0;
              auVar50[6] = auVar38[0xb];
              auVar50[7] = 0;
              auVar50[8] = auVar38[0xc];
              auVar50[9] = 0;
              auVar50[10] = auVar38[0xd];
              auVar50[0xb] = 0;
              auVar50[0xc] = auVar38[0xe];
              auVar50[0xd] = 0;
              auVar50[0xe] = auVar38[0xf];
              auVar50[0xf] = 0;
              auVar61 = pshufb(*(undefined1 (*) [16])(puVar25 + lVar24 * 6),_DAT_0050f8a0);
              auVar38 = pmovzxbw(auVar50,auVar61);
              auVar64[1] = 0;
              auVar64[0] = auVar61[8];
              auVar64[2] = auVar61[9];
              auVar64[3] = 0;
              auVar64[4] = auVar61[10];
              auVar64[5] = 0;
              auVar64[6] = auVar61[0xb];
              auVar64[7] = 0;
              auVar64[8] = auVar61[0xc];
              auVar64[9] = 0;
              auVar64[10] = auVar61[0xd];
              auVar64[0xb] = 0;
              auVar64[0xc] = auVar61[0xe];
              auVar64[0xd] = 0;
              auVar64[0xe] = auVar61[0xf];
              auVar64[0xf] = 0;
              piVar11 = local_aae8;
              puVar32 = local_b088;
              puVar33 = local_afb8;
              lVar28 = 0;
              do {
                lVar36 = 0;
                piVar26 = piVar11;
                do {
                  uVar30 = (ushort)puVar25[lVar36];
                  uVar31 = (uint)uVar30;
                  auVar61 = pshuflw(ZEXT416(uVar31),ZEXT416(uVar31),0);
                  auVar60 = pmovzxbw(auVar61,auVar61);
                  auVar63 = pmaddwd(auVar60,in_XMM2);
                  auVar61 = pmaddwd(auVar60,auVar45);
                  piVar26[-0x34] = auVar63._0_4_ + piVar26[-0x34];
                  piVar26[-0x33] = auVar63._4_4_ + piVar26[-0x33];
                  piVar26[-0x32] = auVar63._8_4_ + piVar26[-0x32];
                  piVar26[-0x31] = auVar63._12_4_ + piVar26[-0x31];
                  piVar26[-0x30] = auVar61._0_4_ + piVar26[-0x30];
                  piVar26[-0x2f] = auVar61._4_4_ + piVar26[-0x2f];
                  piVar26[-0x2e] = auVar61._8_4_ + piVar26[-0x2e];
                  piVar26[-0x2d] = auVar61._12_4_ + piVar26[-0x2d];
                  auVar61 = pmaddwd(auVar60,auVar51);
                  auVar63 = pmaddwd(auVar60,auVar46);
                  piVar26[-0x2c] = auVar61._0_4_ + piVar26[-0x2c];
                  piVar26[-0x2b] = auVar61._4_4_ + piVar26[-0x2b];
                  piVar26[-0x2a] = auVar61._8_4_ + piVar26[-0x2a];
                  piVar26[-0x29] = auVar61._12_4_ + piVar26[-0x29];
                  piVar26[-0x28] = auVar63._0_4_ + piVar26[-0x28];
                  piVar26[-0x27] = auVar63._4_4_ + piVar26[-0x27];
                  piVar26[-0x26] = auVar63._8_4_ + piVar26[-0x26];
                  piVar26[-0x25] = auVar63._12_4_ + piVar26[-0x25];
                  auVar61 = pmaddwd(auVar60,auVar52);
                  auVar63 = pmaddwd(auVar60,auVar47);
                  piVar26[-0x24] = auVar61._0_4_ + piVar26[-0x24];
                  piVar26[-0x23] = auVar61._4_4_ + piVar26[-0x23];
                  piVar26[-0x22] = auVar61._8_4_ + piVar26[-0x22];
                  piVar26[-0x21] = auVar61._12_4_ + piVar26[-0x21];
                  piVar26[-0x20] = auVar63._0_4_ + piVar26[-0x20];
                  piVar26[-0x1f] = auVar63._4_4_ + piVar26[-0x1f];
                  piVar26[-0x1e] = auVar63._8_4_ + piVar26[-0x1e];
                  piVar26[-0x1d] = auVar63._12_4_ + piVar26[-0x1d];
                  auVar61 = pmaddwd(auVar60,auVar53);
                  auVar63 = pmaddwd(auVar60,auVar48);
                  piVar26[-0x1c] = auVar61._0_4_ + piVar26[-0x1c];
                  piVar26[-0x1b] = auVar61._4_4_ + piVar26[-0x1b];
                  piVar26[-0x1a] = auVar61._8_4_ + piVar26[-0x1a];
                  piVar26[-0x19] = auVar61._12_4_ + piVar26[-0x19];
                  piVar26[-0x18] = auVar63._0_4_ + piVar26[-0x18];
                  piVar26[-0x17] = auVar63._4_4_ + piVar26[-0x17];
                  piVar26[-0x16] = auVar63._8_4_ + piVar26[-0x16];
                  piVar26[-0x15] = auVar63._12_4_ + piVar26[-0x15];
                  auVar61 = pmaddwd(auVar60,auVar54);
                  auVar63 = pmaddwd(auVar60,auVar49);
                  piVar26[-0x14] = auVar61._0_4_ + piVar26[-0x14];
                  piVar26[-0x13] = auVar61._4_4_ + piVar26[-0x13];
                  piVar26[-0x12] = auVar61._8_4_ + piVar26[-0x12];
                  piVar26[-0x11] = auVar61._12_4_ + piVar26[-0x11];
                  piVar26[-0x10] = auVar63._0_4_ + piVar26[-0x10];
                  piVar26[-0xf] = auVar63._4_4_ + piVar26[-0xf];
                  piVar26[-0xe] = auVar63._8_4_ + piVar26[-0xe];
                  piVar26[-0xd] = auVar63._12_4_ + piVar26[-0xd];
                  auVar61 = pmaddwd(auVar60,auVar55);
                  auVar63 = pmaddwd(auVar60,auVar50);
                  piVar26[-0xc] = auVar61._0_4_ + piVar26[-0xc];
                  piVar26[-0xb] = auVar61._4_4_ + piVar26[-0xb];
                  piVar26[-10] = auVar61._8_4_ + piVar26[-10];
                  piVar26[-9] = auVar61._12_4_ + piVar26[-9];
                  piVar26[-8] = auVar63._0_4_ + piVar26[-8];
                  piVar26[-7] = auVar63._4_4_ + piVar26[-7];
                  piVar26[-6] = auVar63._8_4_ + piVar26[-6];
                  piVar26[-5] = auVar63._12_4_ + piVar26[-5];
                  auVar61 = pmaddwd(auVar60,auVar38);
                  auVar60 = pmaddwd(auVar60,auVar64);
                  iVar35 = *piVar26;
                  iVar5 = piVar26[1];
                  iVar6 = piVar26[2];
                  iVar7 = piVar26[3];
                  piVar26[-4] = auVar61._0_4_ + piVar26[-4];
                  piVar26[-3] = auVar61._4_4_ + piVar26[-3];
                  piVar26[-2] = auVar61._8_4_ + piVar26[-2];
                  piVar26[-1] = auVar61._12_4_ + piVar26[-1];
                  *(uint *)(puVar32 + lVar36 * 4) = *(int *)(puVar32 + lVar36 * 4) + uVar31;
                  *(uint *)(puVar33 + lVar36 * 4) =
                       *(int *)(puVar33 + lVar36 * 4) + (uint)uVar30 * (uint)bVar1;
                  *piVar26 = auVar60._0_4_ + iVar35;
                  piVar26[1] = auVar60._4_4_ + iVar5;
                  piVar26[2] = auVar60._8_4_ + iVar6;
                  piVar26[3] = auVar60._12_4_ + iVar7;
                  lVar36 = lVar36 + 1;
                  piVar26 = piVar26 + 0x188;
                } while (lVar36 != 7);
                lVar28 = lVar28 + 1;
                puVar33 = puVar33 + 0x1c;
                puVar32 = puVar32 + 0x1c;
                puVar25 = puVar25 + lVar24;
                piVar11 = piVar11 + 0x38;
              } while (lVar28 != 7);
              iVar17 = iVar17 + (uint)bVar1;
            }
            puVar32 = local_b088;
            puVar33 = local_aee8;
            puVar14 = local_afb8;
            puVar21 = local_ae18;
            lVar28 = 0;
            do {
              lVar36 = 0;
              do {
                *(int *)(puVar33 + lVar36 * 4) =
                     *(int *)(puVar33 + lVar36 * 4) + *(int *)(puVar32 + lVar36 * 4) * iVar16;
                *(int *)(puVar21 + lVar36 * 4) =
                     *(int *)(puVar21 + lVar36 * 4) + *(int *)(puVar14 + lVar36 * 4) * iVar16;
                lVar36 = lVar36 + 1;
              } while (lVar36 != 7);
              lVar28 = lVar28 + 1;
              puVar21 = puVar21 + 0x1c;
              puVar14 = puVar14 + 0x1c;
              puVar33 = puVar33 + 0x1c;
              puVar32 = puVar32 + 0x1c;
            } while (lVar28 != 7);
            auVar37._4_4_ = iVar16;
            auVar37._0_4_ = iVar16;
            auVar37._8_4_ = iVar16;
            auVar37._12_4_ = iVar16;
            puVar32 = local_80d8;
            puVar33 = local_abb8;
            lVar28 = 0;
            do {
              lVar36 = 0;
              do {
                auVar38 = pmulld(*(undefined1 (*) [16])(puVar33 + lVar36 * 4),auVar37);
                piVar11 = (int *)(puVar32 + lVar36 * 4);
                iVar35 = piVar11[1];
                iVar5 = piVar11[2];
                iVar6 = piVar11[3];
                piVar26 = (int *)(puVar32 + lVar36 * 4);
                *piVar26 = auVar38._0_4_ + *piVar11;
                piVar26[1] = auVar38._4_4_ + iVar35;
                piVar26[2] = auVar38._8_4_ + iVar5;
                piVar26[3] = auVar38._12_4_ + iVar6;
                lVar36 = lVar36 + 4;
              } while (lVar36 != 0x38);
              lVar28 = lVar28 + 1;
              puVar33 = puVar33 + 0xe0;
              puVar32 = puVar32 + 0xe0;
            } while (lVar28 != 0x31);
            iVar23 = iVar23 + iVar17 * iVar16;
            iVar9 = iVar9 + iVar16;
          } while (iVar9 < iVar12 + v_start);
        }
        puVar32 = local_ae18;
        plVar13 = local_ad48;
        lVar28 = 0;
        do {
          lVar36 = 0;
          do {
            plVar13[lVar36] = plVar13[lVar36] + (long)*(int *)(puVar32 + lVar36 * 4);
            *(undefined4 *)(puVar32 + lVar36 * 4) = 0;
            lVar36 = lVar36 + 1;
          } while (lVar36 != 7);
          lVar28 = lVar28 + 1;
          plVar13 = plVar13 + 7;
          puVar32 = puVar32 + 0x1c;
        } while (lVar28 != 7);
        puVar32 = local_55f8;
        puVar33 = local_80d8;
        lVar28 = 0;
        do {
          lVar36 = 0;
          do {
            auVar38 = pmovsxdq(auVar37,*(undefined8 *)(puVar33 + lVar36 * 4));
            auVar37._0_8_ = auVar38._0_8_ + *(long *)(puVar32 + lVar36 * 8);
            auVar37._8_8_ = auVar38._8_8_ + *(long *)((long)(puVar32 + lVar36 * 8) + 8);
            *(undefined1 (*) [16])(puVar32 + lVar36 * 8) = auVar37;
            *(undefined8 *)(puVar33 + lVar36 * 4) = 0;
            lVar36 = lVar36 + 2;
          } while (lVar36 != 0x38);
          lVar28 = lVar28 + 1;
          puVar33 = puVar33 + 0xe0;
          puVar32 = puVar32 + 0x1c0;
        } while (lVar28 != 0x31);
        v_start = v_start + 0x40;
      } while (v_start < v_end);
    }
    uVar10 = uVar10 / uVar18 & 0xff;
    lVar19 = uVar18 * uVar10 * uVar10;
    lVar24 = 0;
    puVar32 = local_55f8;
    do {
      lVar28 = 0;
      puVar33 = puVar32;
      piVar27 = H;
      do {
        iVar16 = *(int *)(local_aee8 + lVar28 * 4 + lVar24 * 0x1c);
        M[lVar28 * 7 + lVar24] =
             (local_ad48[lVar24 * 7 + lVar28] + lVar19) - ((long)iVar16 + (long)iVar23) * uVar10;
        piVar11 = (int *)local_aee8;
        lVar36 = 0;
        puVar14 = puVar33;
        piVar34 = piVar27;
        do {
          lVar15 = 0;
          piVar26 = piVar11;
          do {
            *(ulong *)((long)piVar34 + lVar15) =
                 (*(long *)(puVar14 + lVar15 * 8) + lVar19) -
                 ((long)*piVar26 + (long)iVar16) * uVar10;
            lVar15 = lVar15 + 8;
            piVar26 = piVar26 + 7;
          } while (lVar15 != 0x38);
          lVar36 = lVar36 + 1;
          piVar34 = piVar34 + 7;
          piVar11 = piVar11 + 1;
          puVar14 = puVar14 + 8;
        } while (lVar36 != 7);
        lVar28 = lVar28 + 1;
        piVar27 = piVar27 + 0x157;
        puVar33 = puVar33 + 0xc40;
      } while (lVar28 != 7);
      lVar24 = lVar24 + 1;
      H = H + 0x31;
      puVar32 = puVar32 + 0x1c0;
    } while (lVar24 != 7);
  }
  return;
}

Assistant:

void av1_compute_stats_sse4_1(int wiener_win, const uint8_t *dgd,
                              const uint8_t *src, int16_t *dgd_avg,
                              int16_t *src_avg, int h_start, int h_end,
                              int v_start, int v_end, int dgd_stride,
                              int src_stride, int64_t *M, int64_t *H,
                              int use_downsampled_wiener_stats) {
  if (wiener_win == WIENER_WIN) {
    compute_stats_win7_opt_sse4_1(dgd, src, h_start, h_end, v_start, v_end,
                                  dgd_stride, src_stride, M, H,
                                  use_downsampled_wiener_stats);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    compute_stats_win5_opt_sse4_1(dgd, src, h_start, h_end, v_start, v_end,
                                  dgd_stride, src_stride, M, H,
                                  use_downsampled_wiener_stats);
  } else {
    av1_compute_stats_c(wiener_win, dgd, src, dgd_avg, src_avg, h_start, h_end,
                        v_start, v_end, dgd_stride, src_stride, M, H,
                        use_downsampled_wiener_stats);
  }
}